

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O1

string * __thiscall
spvtools::val::(anonymous_namespace)::ReflectionInstructionName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,ValidationState_t *_,
          Instruction *inst)

{
  char *__s;
  spv_result_t sVar1;
  size_t sVar2;
  spv_ext_inst_desc desc;
  ostringstream ss;
  undefined1 auStack_198 [8];
  spv_ext_inst_desc local_190;
  long local_188 [14];
  ios_base local_118 [264];
  
  local_190 = (spv_ext_inst_desc)0x0;
  sVar1 = AssemblyGrammar::lookupExtInst
                    ((AssemblyGrammar *)(this + 0x438),SPV_EXT_INST_TYPE_NONSEMANTIC_CLSPVREFLECTION
                     ,*(uint32_t *)&_->context_->operand_table,&local_190);
  if ((sVar1 == SPV_SUCCESS) && (local_190 != (spv_ext_inst_desc)0x0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
    __s = local_190->name;
    if (__s == (char *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_188[0] + -0x18) + 0x10);
    }
    else {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,__s,sVar2);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
    std::ios_base::~ios_base(local_118);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"Unknown ExtInst","");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ReflectionInstructionName(ValidationState_t& _,
                                      const Instruction* inst) {
  spv_ext_inst_desc desc = nullptr;
  if (_.grammar().lookupExtInst(SPV_EXT_INST_TYPE_NONSEMANTIC_CLSPVREFLECTION,
                                inst->word(4), &desc) != SPV_SUCCESS ||
      !desc) {
    return std::string("Unknown ExtInst");
  }
  std::ostringstream ss;
  ss << desc->name;

  return ss.str();
}